

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boids.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2542f::Boid::annotateAvoidObstacle(Boid *this,float minDistanceToCollision)

{
  Vec3 *in_RDI;
  Vec3 VVar1;
  Color white;
  Vec3 BL;
  Vec3 BR;
  Vec3 FL;
  Vec3 FR;
  Vec3 boxFront;
  Vec3 boxSide;
  Color *color;
  Vec3 *endPoint;
  AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
  *in_stack_fffffffffffffe30;
  Color local_88 [3];
  Color local_58;
  Vec3 local_48;
  undefined8 local_38;
  undefined8 local_28;
  Vec3 local_18 [2];
  
  local_38 = (**(code **)(*(long *)in_RDI + 0x10))();
  local_28 = local_38;
  (**(code **)(*(long *)in_RDI + 0xc0))();
  VVar1 = OpenSteer::Vec3::operator*
                    ((Vec3 *)in_stack_fffffffffffffe30,(float)((ulong)in_RDI >> 0x20));
  local_18[0].z = VVar1.z;
  local_48._0_8_ = VVar1._0_8_;
  local_18[0].x = local_48.x;
  local_18[0].y = local_48.y;
  local_48 = VVar1;
  (**(code **)(*(long *)in_RDI + 0x30))();
  VVar1 = OpenSteer::Vec3::operator*
                    ((Vec3 *)in_stack_fffffffffffffe30,(float)((ulong)in_RDI >> 0x20));
  local_58.b_ = VVar1.z;
  local_88[0]._0_8_ = VVar1._0_8_;
  local_58.r_ = local_88[0].r_;
  local_58.g_ = local_88[0].g_;
  (**(code **)(*(long *)in_RDI + 0x40))();
  color = &local_58;
  OpenSteer::Vec3::operator+((Vec3 *)in_stack_fffffffffffffe30,in_RDI);
  endPoint = local_18;
  OpenSteer::Vec3::operator-((Vec3 *)in_stack_fffffffffffffe30,in_RDI);
  (**(code **)(*(long *)in_RDI + 0x40))();
  OpenSteer::Vec3::operator+((Vec3 *)in_stack_fffffffffffffe30,in_RDI);
  OpenSteer::Vec3::operator+((Vec3 *)in_stack_fffffffffffffe30,in_RDI);
  (**(code **)(*(long *)in_RDI + 0x40))();
  OpenSteer::Vec3::operator-((Vec3 *)in_stack_fffffffffffffe30,in_RDI);
  (**(code **)(*(long *)in_RDI + 0x40))();
  OpenSteer::Vec3::operator+((Vec3 *)in_stack_fffffffffffffe30,in_RDI);
  OpenSteer::Color::Color((Color *)&stack0xfffffffffffffe30,1.0,1.0,1.0,1.0);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine(in_stack_fffffffffffffe30,in_RDI,endPoint,color);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine(in_stack_fffffffffffffe30,in_RDI,endPoint,color);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine(in_stack_fffffffffffffe30,in_RDI,endPoint,color);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine(in_stack_fffffffffffffe30,in_RDI,endPoint,color);
  return;
}

Assistant:

void annotateAvoidObstacle (const float minDistanceToCollision)
        {
            const Vec3 boxSide = side() * radius();
            const Vec3 boxFront = forward() * minDistanceToCollision;
            const Vec3 FR = position() + boxFront - boxSide;
            const Vec3 FL = position() + boxFront + boxSide;
            const Vec3 BR = position()            - boxSide;
            const Vec3 BL = position()            + boxSide;
            const Color white (1,1,1);
            annotationLine (FR, FL, white);
            annotationLine (FL, BL, white);
            annotationLine (BL, BR, white);
            annotationLine (BR, FR, white);
        }